

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O0

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::clear_covers(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
               *this)

{
  vector<bool,_std::allocator<bool>_> *pvVar1;
  size_type sVar2;
  Index col;
  Index row;
  reference in_stack_ffffffffffffffc8;
  ulong local_28;
  reference local_20;
  vector<bool,_std::allocator<bool>_> *this_00;
  vector<bool,_std::allocator<bool>_> *this_01;
  
  this_00 = (vector<bool,_std::allocator<bool>_> *)0x0;
  while( true ) {
    this_01 = this_00;
    pvVar1 = (vector<bool,_std::allocator<bool>_> *)
             std::vector<bool,_std::allocator<bool>_>::size(this_00);
    if (pvVar1 <= this_00) break;
    local_20 = std::vector<bool,_std::allocator<bool>_>::operator[]
                         ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffc8._M_mask,
                          (size_type)in_stack_ffffffffffffffc8._M_p);
    std::_Bit_reference::operator=(&local_20,false);
    this_00 = (vector<bool,_std::allocator<bool>_> *)
              ((long)&(this_01->super__Bvector_base<std::allocator<bool>_>)._M_impl.
                      super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p + 1);
  }
  local_28 = 0;
  while( true ) {
    sVar2 = std::vector<bool,_std::allocator<bool>_>::size(this_01);
    if (sVar2 <= local_28) break;
    in_stack_ffffffffffffffc8 =
         std::vector<bool,_std::allocator<bool>_>::operator[]
                   ((vector<bool,_std::allocator<bool>_> *)in_stack_ffffffffffffffc8._M_mask,
                    (size_type)in_stack_ffffffffffffffc8._M_p);
    std::_Bit_reference::operator=((_Bit_reference *)&stack0xffffffffffffffc8,false);
    local_28 = local_28 + 1;
  }
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::clear_covers()
{
    for (Index row = 0; row < row_cover.size(); ++row) {
        row_cover[row] = false;
    }
    for (Index col = 0; col < col_cover.size(); ++col) {
        col_cover[col] = false;
    }
}